

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(OPAtomIndexFooter *this,IndexEntry *Entry)

{
  ILogSink *this_00;
  ulong uVar1;
  IndexTableSegment *pIVar2;
  ui64_t uVar3;
  
  if (this->m_BytesPerEditUnit != 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Call to PushIndexEntry() failed: index is CBR\n");
    return;
  }
  pIVar2 = this->m_CurrentSegment;
  if (pIVar2 == (IndexTableSegment *)0x0) {
    pIVar2 = (IndexTableSegment *)operator_new(0x120);
    IndexTableSegment::IndexTableSegment(pIVar2,(this->super_Partition).m_Dict);
    uVar3 = 0;
  }
  else {
    uVar1 = ((long)(pIVar2->IndexEntryArray).
                   super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                   .
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   .
                   super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar2->IndexEntryArray).
                  super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                  .
                  super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                  .
                  super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar1 < 5000) goto LAB_0019a14d;
    pIVar2->IndexDuration = uVar1;
    uVar3 = pIVar2->IndexStartPosition;
    pIVar2 = (IndexTableSegment *)operator_new(0x120);
    IndexTableSegment::IndexTableSegment(pIVar2,(this->super_Partition).m_Dict);
    uVar3 = uVar3 + uVar1;
  }
  this->m_CurrentSegment = pIVar2;
  (*(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])(this,pIVar2);
  std::
  vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
  ::push_back(&(this->m_CurrentSegment->DeltaEntryArray).
               super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
               .
               super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
              ,&this->m_DefaultDeltaEntry);
  pIVar2 = this->m_CurrentSegment;
  (pIVar2->IndexEditRate).super_Rational = (this->m_EditRate).super_Rational;
  pIVar2->IndexStartPosition = uVar3;
LAB_0019a14d:
  std::
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
  ::push_back(&(pIVar2->IndexEntryArray).
               super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
               .
               super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
              ,Entry);
  return;
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(const IndexTableSegment::IndexEntry& Entry)
{
  if ( m_BytesPerEditUnit != 0 )  // are we CBR? that's bad 
    {
      DefaultLogSink().Error("Call to PushIndexEntry() failed: index is CBR\n");
      return;
    }

  // do we have an available segment?
  if ( m_CurrentSegment == 0 )
    { // no, set up a new segment
      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = 0;
    }
  else if ( m_CurrentSegment->IndexEntryArray.size() >= CBRIndexEntriesPerSegment )
    { // no, this one is full, start another
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      ui64_t StartPosition = m_CurrentSegment->IndexStartPosition + m_CurrentSegment->IndexDuration;

      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = StartPosition;
    }

  m_CurrentSegment->IndexEntryArray.push_back(Entry);
}